

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvref_common.h
# Opt level: O2

int16_t av1_mode_context_analyzer(int16_t *mode_context,MV_REFERENCE_FRAME *rf)

{
  int8_t iVar1;
  uint16_t *puVar2;
  uint uVar3;
  ulong uVar4;
  
  iVar1 = av1_ref_frame_type(rf);
  puVar2 = (uint16_t *)(mode_context + iVar1);
  if ('\0' < rf[1]) {
    uVar3 = *puVar2 & 7;
    uVar4 = 4;
    if ((ushort)uVar3 < 4) {
      uVar4 = (ulong)uVar3;
    }
    puVar2 = compound_mode_ctx_map[*puVar2 >> 5 & 7] + uVar4;
  }
  return *puVar2;
}

Assistant:

static inline int16_t av1_mode_context_analyzer(
    const int16_t *const mode_context, const MV_REFERENCE_FRAME *const rf) {
  const int8_t ref_frame = av1_ref_frame_type(rf);

  if (rf[1] <= INTRA_FRAME) return mode_context[ref_frame];

  const int16_t newmv_ctx = mode_context[ref_frame] & NEWMV_CTX_MASK;
  const int16_t refmv_ctx =
      (mode_context[ref_frame] >> REFMV_OFFSET) & REFMV_CTX_MASK;

  const int16_t comp_ctx = compound_mode_ctx_map[refmv_ctx >> 1][AOMMIN(
      newmv_ctx, COMP_NEWMV_CTXS - 1)];
  return comp_ctx;
}